

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

void Abc_TtMakePosUnate(word *t,int nVars)

{
  int nWords_00;
  int iVar1;
  int local_18;
  int nWords;
  int i;
  int nVars_local;
  word *t_local;
  
  nWords_00 = Abc_TtWordNum(nVars);
  local_18 = 0;
  do {
    if (nVars <= local_18) {
      return;
    }
    iVar1 = Abc_TtNegVar(t,nVars,local_18);
    if (iVar1 == 0) {
      iVar1 = Abc_TtPosVar(t,nVars,local_18);
      if (iVar1 == 0) {
        __assert_fail("Abc_TtPosVar(t, nVars, i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                      ,0x8ed,"void Abc_TtMakePosUnate(word *, int)");
      }
    }
    else {
      Abc_TtFlip(t,nWords_00,local_18);
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

static inline void Abc_TtMakePosUnate( word * t, int nVars )
{
    int i, nWords = Abc_TtWordNum(nVars);
    for ( i = 0; i < nVars; i++ )
        if ( Abc_TtNegVar(t, nVars, i) )
            Abc_TtFlip( t, nWords, i );
        else assert( Abc_TtPosVar(t, nVars, i) );
}